

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O2

void __thiscall binpac::FlowBuffer::NewLine(FlowBuffer *this)

{
  LineBreakStyle LVar1;
  
  NewMessage(this);
  this->mode_ = CR_OR_LF_1;
  this->frame_length_ = 0;
  this->chunked_ = false;
  this->have_pending_request_ = true;
  if (this->state_ == FRAME_0) {
    LVar1 = this->linebreak_style_;
    if (LVar1 != CR_OR_LF) {
      if (LVar1 != STRICT_CRLF) goto LAB_00102656;
      LVar1 = CR_LF_NUL;
    }
    this->state_ = LVar1;
  }
LAB_00102656:
  MarkOrCopyLine(this);
  return;
}

Assistant:

void FlowBuffer::NewLine()
	{
	FlowBuffer::NewMessage();
	mode_ = LINE_MODE;
	frame_length_ = 0;
	chunked_ = false;
	have_pending_request_ = true;
	if ( state_ == FRAME_0 )
		ResetLineState();
	MarkOrCopyLine();
	}